

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PushFunctionScope(cmMakefile *this,string *fileName,PolicyMap *pm)

{
  cmStateSnapshot *originSnapshot;
  _Elt_pointer piVar1;
  bool bVar2;
  cmStateSnapshot local_38;
  
  originSnapshot = &this->StateSnapshot;
  cmState::CreateFunctionCallSnapshot
            (&local_38,this->GlobalGenerator->CMakeInstance->State,originSnapshot,fileName);
  (this->StateSnapshot).Position.Position = local_38.Position.Position;
  (this->StateSnapshot).State = (cmState *)CONCAT44(local_38.State._4_4_,local_38.State._0_4_);
  (this->StateSnapshot).Position.Tree = local_38.Position.Tree;
  bVar2 = cmStateSnapshot::IsValid(originSnapshot);
  if (bVar2) {
    local_38.State._0_4_ = 0;
    piVar1 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar1 == (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>
                (&(this->LoopBlockCounter).c,(int *)&local_38);
    }
    else {
      *piVar1 = 0;
      (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = piVar1 + 1;
    }
    cmFileLockPool::PushFunctionScope(&this->GlobalGenerator->FileLockPool);
    PushFunctionBlockerBarrier(this);
    cmStateSnapshot::PushPolicy(originSnapshot,pm,true);
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                ,0x502,
                "void cmMakefile::PushFunctionScope(const std::string &, const cmPolicies::PolicyMap &)"
               );
}

Assistant:

void cmMakefile::PushFunctionScope(std::string const& fileName,
                                   const cmPolicies::PolicyMap& pm)
{
  this->StateSnapshot = this->GetState()->CreateFunctionCallSnapshot(
    this->StateSnapshot, fileName);
  assert(this->StateSnapshot.IsValid());

  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif

  this->PushFunctionBlockerBarrier();

  this->PushPolicy(true, pm);
}